

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Matrix<double,__1,_1,_0,__1,_1> *rhs,Matrix<double,__1,_1,_0,__1,_1> *dest,
               Scalar *alpha)

{
  ulong uVar1;
  non_const_type pMVar2;
  long cols;
  long rows;
  ResScalar *res;
  undefined8 *puVar3;
  double *__ptr;
  double *pdVar4;
  Scalar alpha_00;
  double dStack_58;
  const_blas_data_mapper<double,_long,_1> local_50;
  const_blas_data_mapper<double,_long,_0> local_40;
  Scalar local_30;
  
  pdVar4 = &dStack_58;
  uVar1 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar1 >> 0x3d == 0) {
    pMVar2 = lhs->m_matrix;
    alpha_00 = *alpha;
    local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (double *)0x0) {
      if (uVar1 < 0x4001) {
        local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)((long)&dStack_58 - (uVar1 * 8 + 0x1e & 0xfffffffffffffff0));
        __ptr = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        pdVar4 = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
      }
      else {
        local_30 = alpha_00;
        local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)malloc(uVar1 * 8);
        if (((ulong)local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data & 0xf) != 0)
        {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        __ptr = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        alpha_00 = local_30;
        if (local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (double *)0x0)
        goto LAB_0014b13b;
      }
    }
    else {
      __ptr = (double *)0x0;
      pdVar4 = &dStack_58;
    }
    cols = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
    rows = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    local_50.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    local_50.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride =
         (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
    res = (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if ((res != (ResScalar *)0x0) &&
       ((dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 0)
       ) {
      pdVar4[-1] = 6.70036018789232e-318;
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1, true>, Level = 0]"
                   );
    }
    pdVar4[-1] = 6.69983153765127e-318;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
    ::run(rows,cols,&local_50,&local_40,res,1,alpha_00);
    if (0x4000 < uVar1) {
      pdVar4[-1] = 6.69991552881106e-318;
      free(__ptr);
    }
    return;
  }
LAB_0014b13b:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::ios::widen;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }